

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O2

string * __thiscall
embree::SceneGraph::stringOfType_abi_cxx11_(string *__return_storage_ptr__,SceneGraph *this,Type ty)

{
  Tag ty_00;
  string sStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  if ((int)this == 8) {
    stringOfTypeTag_abi_cxx11_(&local_38,(SceneGraph *)((ulong)this >> 0x20),ty.ty);
    std::operator+(&local_78,"list ",&local_38);
    std::operator+(&local_58,&local_78," ");
    stringOfTypeTag_abi_cxx11_(&sStack_98,(SceneGraph *)(ty._0_8_ & 0xffffffff),ty_00);
    std::operator+(__return_storage_ptr__,&local_58,&sStack_98);
    std::__cxx11::string::~string((string *)&sStack_98);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    stringOfTypeTag_abi_cxx11_(__return_storage_ptr__,this,ty.ty);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string stringOfType(Type ty) {
      if (ty.ty == Type::PTY_LIST) return "list " + stringOfTypeTag(ty.index) + " " + stringOfTypeTag(ty.data);
      else return stringOfTypeTag(ty.ty);
    }